

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sound_envs.cxx
# Opt level: O3

void __thiscall
xray_re::xr_sound_env_object::xr_sound_env_object(xr_sound_env_object *this,xr_scene *scene)

{
  xr_shape_object::xr_shape_object(&this->super_xr_shape_object,scene,TOOLS_CLASS_SOUND_ENV);
  (this->super_xr_shape_object).super_xr_custom_object._vptr_xr_custom_object =
       (_func_int **)&PTR__xr_sound_env_object_0024af98;
  (this->m_inner)._M_dataplus._M_p = (pointer)&(this->m_inner).field_2;
  (this->m_inner)._M_string_length = 0;
  (this->m_inner).field_2._M_local_buf[0] = '\0';
  (this->m_outer)._M_dataplus._M_p = (pointer)&(this->m_outer).field_2;
  (this->m_outer)._M_string_length = 0;
  (this->m_outer).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

xr_sound_env_object::xr_sound_env_object(xr_scene& scene):
	xr_shape_object(scene, TOOLS_CLASS_SOUND_ENV) {}